

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O0

void Image_Function::
     VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (ImageTemplate<unsigned_char> *image,ImageTemplate<unsigned_char> *args,
               ImageTemplate<unsigned_char> *args_1)

{
  ImageTemplate<unsigned_char> *in_RDX;
  ImageTemplate<unsigned_char> *in_RSI;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in_stack_ffffffffffffffb0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(in_RSI,in_RDX);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_RSI,in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x123d14);
  return;
}

Assistant:

void VerifyGrayScaleImage( const TImage & image, Args... args)
    {
        VerifyGrayScaleImage( image );
        VerifyGrayScaleImage( args... );
    }